

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O0

void vrna_md_defaults_temperature(double T)

{
  double dVar1;
  double dVar2;
  double T_local;
  
  dVar1 = T;
  dVar2 = T;
  if (T < -273.15) {
    vrna_message_warning
              (
              "vrna_md_defaults_temperature@model.c: Temperature out of range, T must be above absolute zero. Not changing anything!"
              );
    dVar1 = temperature;
    dVar2 = defaults.temperature;
  }
  defaults.temperature = dVar2;
  temperature = dVar1;
  return;
}

Assistant:

PUBLIC void
vrna_md_defaults_temperature(double T)
{
  if (T >= -K0) {
    defaults.temperature = T;
#ifndef VRNA_DISABLE_BACKWARD_COMPATIBILITY
    temperature = T;
#endif
  } else {
    vrna_message_warning(
      "vrna_md_defaults_temperature@model.c: Temperature out of range, T must be above absolute zero. Not changing anything!");
  }
}